

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aomdec.c
# Opt level: O0

FILE * open_outfile(char *name)

{
  int iVar1;
  char *in_RDI;
  FILE *file;
  FILE *local_8;
  
  iVar1 = strcmp("-",in_RDI);
  if (iVar1 == 0) {
    set_binary_mode((FILE *)_stdout);
    local_8 = _stdout;
  }
  else {
    local_8 = fopen64(in_RDI,"wb");
    if (local_8 == (FILE *)0x0) {
      fatal("Failed to open output file \'%s\'",in_RDI);
    }
  }
  return (FILE *)local_8;
}

Assistant:

static FILE *open_outfile(const char *name) {
  if (strcmp("-", name) == 0) {
    set_binary_mode(stdout);
    return stdout;
  } else {
    FILE *file = fopen(name, "wb");
    if (!file) fatal("Failed to open output file '%s'", name);
    return file;
  }
}